

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::Internal::log_thread_callback(LogLevel level,char *fmt,...)

{
  long *in_FS_OFFSET;
  bool bVar1;
  char local_2038 [8];
  char buffer [8192];
  va_list va;
  char *fmt_local;
  LogLevel level_local;
  
  bVar1 = *(long *)(*in_FS_OFFSET + -0x10) != 0;
  if (bVar1) {
    buffer[0x1ffc] = '0';
    buffer[0x1ffd] = '\0';
    buffer[0x1ffe] = '\0';
    buffer[0x1fff] = '\0';
    buffer[0x1ff8] = '\x10';
    buffer[0x1ff9] = '\0';
    buffer[0x1ffa] = '\0';
    buffer[0x1ffb] = '\0';
    vsnprintf(local_2038,0x2000,fmt,buffer + 0x1ff8);
    buffer[0x1ff7] = '\0';
    (**(code **)(*in_FS_OFFSET + -0x10))(level,local_2038,*(undefined8 *)(*in_FS_OFFSET + -8));
  }
  return bVar1;
}

Assistant:

bool log_thread_callback(LogLevel level, const char *fmt, ...)
{
	if (!thread_log_callback)
		return false;

	va_list va;
	va_start(va, fmt);
	char buffer[8 * 1024];
	vsnprintf(buffer, sizeof(buffer), fmt, va);
	// Guard against ancient MSVC bugs.
	buffer[sizeof(buffer) - 1] = '\0';
	va_end(va);
	thread_log_callback(level, buffer, thread_log_userdata);
	return true;
}